

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

bool gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest::
     verifyInteger<8u,8u,8u,8u,int>(GLint original_value,GLint positive_value,GLint negated_value)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  longdouble in_ST0;
  longdouble lVar6;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  Integer<int,_8U,_24U> negated_alpha;
  Integer<int,_8U,_24U> positive_alpha;
  Integer<int,_8U,_16U> negated_blue;
  Integer<int,_8U,_16U> positive_blue;
  Integer<int,_8U,_8U> negated_green;
  Integer<int,_8U,_8U> positive_green;
  Integer<int,_8U,_0U> negated_red;
  Integer<int,_8U,_0U> positive_red;
  Integer<int,_8U,_24U> local_38;
  Integer<int,_8U,_24U> local_34;
  Integer<int,_8U,_16U> local_30;
  Integer<int,_8U,_16U> local_2c;
  Integer<int,_8U,_8U> local_28;
  Integer<int,_8U,_8U> local_24;
  Integer<int,_8U,_0U> local_20;
  Integer<int,_8U,_0U> local_1c;
  
  if (original_value != positive_value) {
    return false;
  }
  local_38.m_raw = negated_value;
  local_34.m_raw = original_value;
  local_30.m_raw = negated_value;
  local_2c.m_raw = original_value;
  local_28.m_raw = negated_value;
  local_24.m_raw = original_value;
  local_20.m_raw = negated_value;
  local_1c.m_raw = original_value;
  iVar2 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_0U>::Get
                    (&local_1c);
  lVar6 = in_ST5;
  lVar7 = in_ST5;
  exp2l();
  exp2l();
  iVar1 = (int)ROUND(-(longdouble)1 + in_ST1);
  iVar5 = -iVar2;
  if (SBORROW4(iVar1,-iVar2) != iVar1 + iVar2 < 0) {
    iVar5 = iVar1;
  }
  bVar4 = (byte)iVar5;
  if (iVar5 <= (int)ROUND(-in_ST0)) {
    bVar4 = (byte)(int)ROUND(-in_ST0);
  }
  uVar3 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_0U>::Get
                    (&local_20);
  if (bVar4 == uVar3) {
    iVar2 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_16U>::Get
                      (&local_2c);
    exp2l();
    exp2l();
    iVar1 = (int)ROUND(-(longdouble)1 + in_ST3);
    iVar5 = -iVar2;
    if (SBORROW4(iVar1,-iVar2) != iVar1 + iVar2 < 0) {
      iVar5 = iVar1;
    }
    bVar4 = (byte)iVar5;
    if (iVar5 <= (int)ROUND(-in_ST2)) {
      bVar4 = (byte)(int)ROUND(-in_ST2);
    }
    uVar3 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_16U>::Get
                      (&local_30);
    if (bVar4 == uVar3) {
      iVar2 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_8U>::Get
                        (&local_24);
      exp2l();
      exp2l();
      iVar1 = (int)ROUND(-(longdouble)1 + in_ST5);
      iVar5 = -iVar2;
      if (SBORROW4(iVar1,-iVar2) != iVar1 + iVar2 < 0) {
        iVar5 = iVar1;
      }
      bVar4 = (byte)iVar5;
      if (iVar5 <= (int)ROUND(-in_ST4)) {
        bVar4 = (byte)(int)ROUND(-in_ST4);
      }
      uVar3 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_8U>::Get
                        (&local_28);
      if (bVar4 == uVar3) {
        iVar2 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_24U>::
                Get(&local_34);
        exp2l();
        exp2l();
        iVar1 = (int)ROUND(-(longdouble)1 + lVar7);
        iVar5 = -iVar2;
        if (SBORROW4(iVar1,-iVar2) != iVar1 + iVar2 < 0) {
          iVar5 = iVar1;
        }
        bVar4 = (byte)iVar5;
        if (iVar5 <= (int)ROUND(-lVar6)) {
          bVar4 = (byte)(int)ROUND(-lVar6);
        }
        uVar3 = gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::Integer<int,_8U,_24U>::
                Get(&local_38);
        return bVar4 == uVar3;
      }
    }
  }
  return false;
}

Assistant:

static bool verifyInteger(GLint original_value, GLint positive_value, GLint negated_value)
	{
		if (original_value != positive_value)
		{
			return false;
		}

		Integer<T, R, 0> positive_red(positive_value);
		Integer<T, R, 0> negated_red(negated_value);

		Integer<T, G, R> positive_green(positive_value);
		Integer<T, G, R> negated_green(negated_value);

		Integer<T, B, R + G> positive_blue(positive_value);
		Integer<T, B, R + G> negated_blue(negated_value);

		Integer<T, A, R + G + B> positive_alpha(positive_value);
		Integer<T, A, R + G + B> negated_alpha(negated_value);

		if (((0 != R) && (positive_red.GetNegated() != negated_red.Get())) ||
			((0 != B) && (positive_blue.GetNegated() != negated_blue.Get())) ||
			((0 != G) && (positive_green.GetNegated() != negated_green.Get())) ||
			((0 != A) && (positive_alpha.GetNegated() != negated_alpha.Get())))
		{
			return false;
		}

		return true;
	}